

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateProto2NamespaceEnumSpecializations
          (FileGenerator *this,Printer *p)

{
  pointer puVar1;
  bool bVar2;
  char *pcVar3;
  undefined8 uVar4;
  unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
  *gen;
  pointer puVar5;
  NamespaceOpener ns;
  
  bVar2 = HasEnumDefinitions(this->file_);
  if (bVar2) {
    google::protobuf::io::Printer::WriteRaw((char *)p,0x3ee526);
    bVar2 = (this->options_).opensource_runtime != false;
    uVar4 = 6;
    if (bVar2) {
      uVar4 = 0x10;
    }
    pcVar3 = "proto2";
    if (bVar2) {
      pcVar3 = "google::protobuf";
    }
    NamespaceOpener::NamespaceOpener(&ns,uVar4,pcVar3,p);
    google::protobuf::io::Printer::WriteRaw((char *)p,0x3ee526);
    puVar1 = (this->enum_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar5 = (this->enum_generators_).
                  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1)
    {
      EnumGenerator::GenerateGetEnumDescriptorSpecializations
                ((puVar5->_M_t).
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_false>.
                 _M_head_impl,p);
    }
    google::protobuf::io::Printer::WriteRaw((char *)p,0x3ee526);
    NamespaceOpener::~NamespaceOpener(&ns);
  }
  return;
}

Assistant:

void FileGenerator::GenerateProto2NamespaceEnumSpecializations(io::Printer* p) {
  // Emit GetEnumDescriptor specializations into google::protobuf namespace.
  if (!HasEnumDefinitions(file_)) {
    return;
  }

  p->PrintRaw("\n");
  NamespaceOpener ns(ProtobufNamespace(options_), p);
  p->PrintRaw("\n");
  for (auto& gen : enum_generators_) {
    gen->GenerateGetEnumDescriptorSpecializations(p);
  }
  p->PrintRaw("\n");
}